

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lclin.cpp
# Opt level: O0

void __thiscall libDAI::LCLin::LCLin(LCLin *this,FactorGraph *fg,Properties *opts)

{
  undefined1 auVar1 [64];
  unsigned_long uVar2;
  unsigned_long uVar3;
  byte bVar4;
  undefined8 uVar5;
  size_t sVar6;
  edge_type *peVar7;
  long *plVar8;
  TFactor<double> *pTVar9;
  ulong uVar10;
  Var *pVVar11;
  value_type *__x;
  long *in_RDI;
  size_t i_2;
  size_t i_1;
  size_t I;
  size_t i;
  size_t iI;
  value_type *in_stack_fffffffffffffd48;
  FactorGraph *in_stack_fffffffffffffd50;
  TFactor<double> *this_00;
  Var *in_stack_fffffffffffffd58;
  TFactor<double> *in_stack_fffffffffffffd60;
  FactorGraph *in_stack_fffffffffffffd68;
  Var *n;
  DAIAlg<libDAI::FactorGraph> *in_stack_fffffffffffffd70;
  allocator<char> *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffdc0;
  size_t in_stack_fffffffffffffdc8;
  Exception *in_stack_fffffffffffffdd0;
  VarSet *this_01;
  Var *local_128;
  size_type local_e8;
  ulong local_58;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             (Properties *)in_stack_fffffffffffffd60);
  *in_RDI = (long)&PTR_clone_00d4e4d8;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  *(undefined1 (*) [64])(in_RDI + 0x2b) = auVar1;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  *(undefined1 (*) [64])(in_RDI + 0x23) = auVar1;
  in_RDI[0x33] = 0;
  {unnamed_type#1}::LCLin((anon_struct_136_10_9d8586a4_for_Props *)in_stack_fffffffffffffd50);
  in_RDI[0x34] = 0;
  in_RDI[0x35] = 0;
  *(undefined1 (*) [16])(in_RDI + 0x36) = (undefined1  [16])0x0;
  in_RDI[0x38] = 0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb7ebee)
  ;
  in_RDI[0x39] = 0;
  in_RDI[0x3a] = 0;
  in_RDI[0x3b] = 0;
  std::
  vector<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ::vector((vector<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
            *)0xb7ec29);
  in_RDI[0x3c] = 0;
  in_RDI[0x3d] = 0;
  in_RDI[0x3e] = 0;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)0xb7ec64)
  ;
  bVar4 = (**(code **)(*in_RDI + 0x88))();
  if ((bVar4 & 1) == 0) {
    uVar5 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    Exception::Exception
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    __cxa_throw(uVar5,&Exception::typeinfo,Exception::~Exception);
  }
  (**(code **)(*in_RDI + 0x28))();
  FactorGraph::nrEdges((FactorGraph *)0xb7edf0);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_fffffffffffffd90,(size_type)in_stack_fffffffffffffd88);
  local_58 = 0;
  while( true ) {
    (**(code **)(*in_RDI + 0x28))();
    sVar6 = FactorGraph::nrEdges((FactorGraph *)0xb7ee55);
    if (sVar6 <= local_58) break;
    (**(code **)(*in_RDI + 0x28))();
    peVar7 = FactorGraph::edge(in_stack_fffffffffffffd50,(size_t)in_stack_fffffffffffffd48);
    uVar2 = peVar7->first;
    (**(code **)(*in_RDI + 0x28))();
    peVar7 = FactorGraph::edge(in_stack_fffffffffffffd50,(size_t)in_stack_fffffffffffffd48);
    uVar3 = peVar7->second;
    this_01 = (VarSet *)(in_RDI + 0x36);
    plVar8 = (long *)(**(code **)(*in_RDI + 0x28))();
    pTVar9 = (TFactor<double> *)(**(code **)(*plVar8 + 0x50))(plVar8,uVar3);
    TFactor<double>::vars(pTVar9);
    plVar8 = (long *)(**(code **)(*in_RDI + 0x28))();
    (**(code **)(*plVar8 + 0x30))(plVar8,uVar2);
    VarSet::VarSet(&in_stack_fffffffffffffd60->_vs,in_stack_fffffffffffffd58);
    VarSet::operator/(this_01,&pTVar9->_vs);
    TFactor<double>::TFactor
              ((TFactor<double> *)in_stack_fffffffffffffd70,(VarSet *)in_stack_fffffffffffffd68);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffd50);
    VarSet::~VarSet((VarSet *)0xb7f035);
    VarSet::~VarSet((VarSet *)0xb7f042);
    local_58 = local_58 + 1;
  }
  plVar8 = (long *)(**(code **)(*in_RDI + 0x28))();
  (**(code **)(*plVar8 + 0x28))();
  std::
  vector<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
  ::resize((vector<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
            *)in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
  local_e8 = 0;
  while( true ) {
    plVar8 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar10 = (**(code **)(*plVar8 + 0x28))();
    if (uVar10 <= local_e8) break;
    in_stack_fffffffffffffd90 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
         ::operator[]((vector<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>,_std::allocator<std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>_>
                       *)(in_RDI + 0x39),local_e8);
    TFactor<double>::TFactor(in_stack_fffffffffffffd60);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffd50);
    local_e8 = local_e8 + 1;
  }
  plVar8 = (long *)(**(code **)(*in_RDI + 0x28))();
  (**(code **)(*plVar8 + 0x28))();
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
             in_stack_fffffffffffffd90,(size_type)plVar8);
  local_128 = (Var *)0x0;
  while( true ) {
    n = local_128;
    pTVar9 = (TFactor<double> *)(**(code **)(*in_RDI + 0x28))();
    pVVar11 = (Var *)(**(code **)((long)((pTVar9->_vs)._vars.
                                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2) + 8))();
    if (pVVar11 <= n) break;
    this_00 = (TFactor<double> *)(in_RDI + 0x3c);
    plVar8 = (long *)(**(code **)(*in_RDI + 0x28))();
    __x = (value_type *)(**(code **)(*plVar8 + 0x30))(plVar8,local_128);
    TFactor<double>::TFactor(pTVar9,n);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)this_00
               ,__x);
    TFactor<double>::~TFactor(this_00);
    local_128 = (Var *)((long)&local_128->_label + 1);
  }
  return;
}

Assistant:

LCLin::LCLin(const FactorGraph & fg, const Properties &opts) : DAIAlgFG(fg, opts), Props(), _maxdiff(0.0), _iterations(0UL), _phis(), _gamma(), _beliefs() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        // create phis
        _phis.reserve(grm().nrEdges());
        for( size_t iI = 0; iI < grm().nrEdges(); iI++ ) {
            size_t i = grm().edge(iI).first;
            size_t I = grm().edge(iI).second;
            _phis.push_back( Factor( grm().factor(I).vars() / grm().var(i) ) );
        }

        // Construct _gamma
        _gamma.resize( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            _gamma[i].push_back(Factor());

        // create beliefs
        _beliefs.reserve( grm().nrVars() );
        for( size_t i=0; i < grm().nrVars(); i++ )
            _beliefs.push_back(Factor(grm().var(i)));
    }